

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::to_hex_string_abi_cxx11_(lest *this,char c)

{
  ostream *poVar1;
  string local_1c8 [34];
  char local_1a6;
  char local_1a5;
  int local_1a4;
  int local_1a0;
  ostringstream local_190 [8];
  ostringstream os;
  char c_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"\\x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  local_1a4 = (int)std::setw(2);
  local_1a0 = local_1a4;
  poVar1 = std::operator<<(poVar1,(_Setw)local_1a4);
  local_1a6 = (char)std::setfill<char>('0');
  local_1a5 = local_1a6;
  poVar1 = std::operator<<(poVar1,local_1a6);
  std::ostream::operator<<(poVar1,(uint)(byte)c);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

inline std::string to_hex_string(char c)
{
    std::ostringstream os;
    os << "\\x" << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>( static_cast<unsigned char>(c) );
    return os.str();
}